

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
          (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this,BuildKey *Elt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  uint uVar3;
  void *pvVar4;
  pointer pcVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 *puVar8;
  
  if ((this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
      super_SmallVectorBase.Capacity <=
      (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
      super_SmallVectorBase.Size) {
    grow(this,0);
  }
  pvVar4 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
           super_SmallVectorBase.BeginX;
  lVar7 = (ulong)(this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                 super_SmallVectorBase.Size * 0x20;
  plVar2 = (long *)((long)pvVar4 + lVar7);
  puVar8 = (undefined8 *)(lVar7 + (long)pvVar4);
  *puVar8 = puVar8 + 2;
  pcVar5 = (Elt->key).key._M_dataplus._M_p;
  paVar1 = &(Elt->key).key.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar6 = *(undefined8 *)((long)&(Elt->key).key.field_2 + 8);
    puVar8[2] = paVar1->_M_allocated_capacity;
    puVar8[3] = uVar6;
  }
  else {
    *plVar2 = (long)pcVar5;
    plVar2[2] = paVar1->_M_allocated_capacity;
  }
  plVar2[1] = (Elt->key).key._M_string_length;
  (Elt->key).key._M_dataplus._M_p = (pointer)paVar1;
  (Elt->key).key._M_string_length = 0;
  (Elt->key).key.field_2._M_local_buf[0] = '\0';
  uVar3 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
          super_SmallVectorBase.Size;
  if (uVar3 < (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
              super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
    super_SmallVectorBase.Size = uVar3 + 1;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }